

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O2

string * __thiscall
iDynTree::SixAxisForceTorqueSensor::getParentJoint_abi_cxx11_
          (string *__return_storage_ptr__,SixAxisForceTorqueSensor *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->pimpl->parent_junction_name);
  return __return_storage_ptr__;
}

Assistant:

std::string SixAxisForceTorqueSensor::getParentJoint() const
{
    return this->pimpl->parent_junction_name;
}